

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::GeneratePrivateMembers
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *file;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  RepeatedEnumFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  Formatter::operator()<>((Formatter *)local_50,"::$proto_ns$::RepeatedField<int> $name$_;\n");
  bVar1 = FieldDescriptor::is_packed((this->super_FieldGenerator).descriptor_);
  if (bVar1) {
    file = FieldDescriptor::file((this->super_FieldGenerator).descriptor_);
    bVar1 = HasGeneratedMethods(file,(this->super_FieldGenerator).options_);
    if (bVar1) {
      Formatter::operator()<>
                ((Formatter *)local_50,"mutable std::atomic<int> _$name$_cached_byte_size_;\n");
    }
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::GeneratePrivateMembers(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format("::$proto_ns$::RepeatedField<int> $name$_;\n");
  if (descriptor_->is_packed() &&
      HasGeneratedMethods(descriptor_->file(), options_)) {
    format("mutable std::atomic<int> _$name$_cached_byte_size_;\n");
  }
}